

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O2

void __thiscall
deqp::egl::SingleThreadColorClearCase::executeForContexts
          (SingleThreadColorClearCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  EGLint EVar1;
  TestLog *log;
  EGLDisplay pvVar2;
  deUint32 dVar3;
  RGBA RVar4;
  Library *pLVar5;
  pointer ppVar6;
  int iVar7;
  pointer pCVar8;
  bool bVar9;
  RGBA local_1b5c;
  SingleThreadColorClearCase *local_1b58;
  EGLSurface local_1b50;
  vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *local_1b48;
  Library *local_1b40;
  int local_1b34;
  EGLDisplay local_1b30;
  vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_> clears;
  PixelFormat pixelFmt;
  ClearOp clear;
  Surface frame;
  Surface refFrame;
  Random rnd;
  IVec2 surfaceSize;
  PixelBufferAccess local_1a80;
  ApiFunctions funcs;
  
  local_1b48 = contexts;
  pLVar5 = EglTestContext::getLibrary
                     ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                      super_TestCase.m_eglTestCtx);
  local_1b50 = surface;
  eglu::getSurfaceSize((eglu *)&surfaceSize,pLVar5,display,surface);
  log = ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.super_TestCase
         .super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b58 = this;
  tcu::Surface::Surface(&refFrame,surfaceSize.m_data[0],surfaceSize.m_data[1]);
  tcu::Surface::Surface(&frame,surfaceSize.m_data[0],surfaceSize.m_data[1]);
  pixelFmt = getPixelFormat(pLVar5,display,config->config);
  dVar3 = deStringHash((local_1b58->super_MultiContextRenderCase).super_RenderCase.
                       super_SimpleConfigCase.super_TestCase.super_TestCase.super_TestNode.m_name.
                       _M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glw::Functions::Functions(&funcs.gl);
  EglTestContext::initGLFunctions
            ((local_1b58->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
             super_TestCase.m_eglTestCtx,&funcs.gl,(ApiType)0x2);
  ppVar6 = (local_1b48->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar1 = ppVar6->first;
  clear.x = 0;
  clear.y = 0;
  clear.width = surfaceSize.m_data[0];
  clear.height = surfaceSize.m_data[1];
  clear.color.m_value = 0xff000000;
  local_1b30 = display;
  (*pLVar5->_vptr_Library[0x27])(pLVar5,display,local_1b50,local_1b50,ppVar6->second);
  dVar3 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
  eglu::checkError(dVar3,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                   ,0xc6);
  renderClear(EVar1,&funcs,&clear);
  finish(EVar1,&funcs);
  std::vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>::push_back(&clears,&clear);
  iVar7 = 0;
  local_1b40 = pLVar5;
  while (pvVar2 = local_1b30, pLVar5 = local_1b40,
        ppVar6 = (local_1b48->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start, iVar7 != 3) {
    for (; local_1b34 = iVar7,
        ppVar6 != (local_1b48->
                  super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
      EVar1 = ppVar6->first;
      (*local_1b40->_vptr_Library[0x27])(local_1b40,local_1b30,local_1b50,local_1b50,ppVar6->second)
      ;
      dVar3 = (*local_1b40->_vptr_Library[0x1f])();
      eglu::checkError(dVar3,"eglMakeCurrent",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                       ,0xd6);
      iVar7 = 2;
      while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
        computeRandomClear(&clear,&rnd,surfaceSize.m_data[0],surfaceSize.m_data[1]);
        renderClear(EVar1,&funcs,&clear);
        std::vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>::push_back
                  (&clears,&clear);
      }
      finish(EVar1,&funcs);
      iVar7 = local_1b34;
    }
    iVar7 = local_1b34 + 1;
  }
  EVar1 = ppVar6->first;
  (*local_1b40->_vptr_Library[0x27])(local_1b40,local_1b30,local_1b50);
  dVar3 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
  eglu::checkError(dVar3,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                   ,0xea);
  readPixels(EVar1,&funcs,&frame);
  (*pLVar5->_vptr_Library[0x27])(pLVar5,pvVar2,0,0);
  dVar3 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
  eglu::checkError(dVar3,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                   ,0xf0);
  for (pCVar8 = clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar8 != clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
                _M_impl.super__Vector_impl_data._M_finish; pCVar8 = pCVar8 + 1) {
    tcu::Surface::getAccess(&local_1a80,&refFrame);
    tcu::getSubregion((PixelBufferAccess *)&clear,&local_1a80,pCVar8->x,pCVar8->y,0,pCVar8->width,
                      pCVar8->height,1);
    local_1b5c = tcu::PixelFormat::convertColor(&pixelFmt,&pCVar8->color);
    tcu::RGBA::toIVec((RGBA *)&local_1a80);
    tcu::clear((PixelBufferAccess *)&clear,(IVec4 *)&local_1a80);
  }
  local_1a80.super_ConstPixelBufferAccess.m_format.order = 0x1010101;
  local_1b5c = tcu::PixelFormat::getColorThreshold(&pixelFmt);
  RVar4 = tcu::operator+((RGBA *)&local_1a80,&local_1b5c);
  clear.x = RVar4.m_value;
  bVar9 = tcu::pixelThresholdCompare
                    (log,"ComparisonResult","Image comparison result",&refFrame,&frame,
                     (RGBA *)&clear,COMPARE_LOG_RESULT);
  if (!bVar9) {
    tcu::TestContext::setTestResult
              ((local_1b58->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  std::_Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>::~_Vector_base
            (&clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>);
  tcu::Surface::~Surface(&frame);
  tcu::Surface::~Surface(&refFrame);
  return;
}

Assistant:

void SingleThreadColorClearCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&		egl			= m_eglTestCtx.getLibrary();

	const tcu::IVec2	surfaceSize	= eglu::getSurfaceSize(egl, display, surface);
	const int			width		= surfaceSize.x();
	const int			height		= surfaceSize.y();

	TestLog&			log			= m_testCtx.getLog();

	tcu::Surface		refFrame	(width, height);
	tcu::Surface		frame		(width, height);
	tcu::PixelFormat	pixelFmt	= getPixelFormat(egl, display, config.config);

	de::Random			rnd			(deStringHash(getName()));
	vector<ClearOp>		clears;
	const int			ctxClears	= 2;
	const int			numIters	= 3;

	ApiFunctions		funcs;

	m_eglTestCtx.initGLFunctions(&funcs.gl, glu::ApiType::es(2,0));

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;
		ClearOp		clear		(0, 0, width, height, RGBA::black());

		egl.makeCurrent(display, surface, surface, context);
		EGLU_CHECK_MSG(egl, "eglMakeCurrent");

		renderClear(api, funcs, clear);
		finish(api, funcs);
		clears.push_back(clear);
	}

	// Render.
	for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
	{
		for (vector<std::pair<EGLint, EGLContext> >::const_iterator ctxIter = contexts.begin(); ctxIter != contexts.end(); ctxIter++)
		{
			EGLint		api			= ctxIter->first;
			EGLContext	context		= ctxIter->second;

			egl.makeCurrent(display, surface, surface, context);
			EGLU_CHECK_MSG(egl, "eglMakeCurrent");

			for (int clearNdx = 0; clearNdx < ctxClears; clearNdx++)
			{
				ClearOp clear = computeRandomClear(rnd, width, height);

				renderClear(api, funcs, clear);
				clears.push_back(clear);
			}

			finish(api, funcs);
		}
	}

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		egl.makeCurrent(display, surface, surface, context);
		EGLU_CHECK_MSG(egl, "eglMakeCurrent");

		readPixels(api, funcs, frame);
	}

	egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
	EGLU_CHECK_MSG(egl, "eglMakeCurrent");

	// Render reference.
	renderReference(refFrame, clears, pixelFmt);

	// Compare images
	{
		bool imagesOk = tcu::pixelThresholdCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, RGBA(1,1,1,1) + pixelFmt.getColorThreshold(), tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}